

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMot<(moira::Mode)10,_1> wrapper)

{
  uint uVar1;
  i32 iVar2;
  Int IVar3;
  Syntax SVar4;
  char *pcVar5;
  Int IVar6;
  short sVar7;
  uint uVar8;
  char *pcVar9;
  ushort uVar10;
  char cVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  Scale s;
  Rn rn;
  
  uVar1 = (wrapper.ea)->ext1;
  if ((uVar1 >> 8 & 1) == 0) {
    pcVar9 = this->ptr;
    this->ptr = pcVar9 + 1;
    *pcVar9 = '(';
    operator<<(this,(Int)(int)(char)uVar1);
    pcVar9 = this->ptr;
    this->ptr = pcVar9 + 1;
    *pcVar9 = ',';
    operator<<(this);
    pcVar9 = this->ptr;
    this->ptr = pcVar9 + 1;
    *pcVar9 = ',';
    s.raw = uVar1 >> 9 & 3;
    operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
    pcVar9 = "$%x.l";
    if ((uVar1 >> 0xb & 1) == 0) {
      pcVar9 = "$%x.w";
    }
    pcVar9 = pcVar9 + 3;
    cVar11 = *pcVar9;
    while (cVar11 != '\0') {
      pcVar9 = pcVar9 + 1;
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = cVar11;
      cVar11 = *pcVar9;
    }
  }
  else {
    uVar13 = uVar1 & 0xffff;
    rn.raw = uVar13 >> 0xc;
    uVar8 = uVar13 >> 0xb;
    s.raw = uVar1 >> 9 & 3;
    uVar14 = uVar13 >> 7;
    uVar13 = uVar13 >> 6;
    uVar10 = (ushort)(uVar1 >> 4) & 3;
    iVar2 = (wrapper.ea)->ext2;
    sVar7 = (short)iVar2;
    if ((uVar1 & 7) != 0) {
      IVar3.raw = (wrapper.ea)->ext3;
      cVar11 = '(';
      lVar12 = 0;
      if ((uVar1 & 4) == 0) {
        do {
          pcVar9 = this->ptr;
          this->ptr = pcVar9 + 1;
          *pcVar9 = cVar11;
          cVar11 = "(["[lVar12 + 1];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 2);
        IVar6.raw = (int)sVar7;
        if (uVar10 == 3) {
          IVar6.raw = iVar2;
        }
        operator<<(this,IVar6);
        pcVar9 = this->ptr;
        this->ptr = pcVar9 + 1;
        *pcVar9 = ',';
        SVar4 = this->style->syntax;
        if ((uVar14 & 1) == 0) {
          if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
            pcVar9 = this->ptr;
            this->ptr = pcVar9 + 1;
            *pcVar9 = ' ';
          }
          operator<<(this);
        }
        else {
          if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
            pcVar9 = this->ptr;
            this->ptr = pcVar9 + 1;
            *pcVar9 = ' ';
          }
          operator<<(this);
        }
        if ((uVar13 & 1) == 0) {
          pcVar9 = this->ptr;
          this->ptr = pcVar9 + 1;
          *pcVar9 = ',';
          SVar4 = this->style->syntax;
          if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
            pcVar9 = this->ptr;
            this->ptr = pcVar9 + 1;
            *pcVar9 = ' ';
          }
          operator<<(this,rn);
          pcVar9 = "$%x.l";
          if ((uVar8 & 1) == 0) {
            pcVar9 = "$%x.w";
          }
          pcVar9 = pcVar9 + 3;
          cVar11 = *pcVar9;
          while (cVar11 != '\0') {
            pcVar9 = pcVar9 + 1;
            pcVar5 = this->ptr;
            this->ptr = pcVar5 + 1;
            *pcVar5 = cVar11;
            cVar11 = *pcVar9;
          }
          operator<<(this,s);
        }
        pcVar9 = this->ptr;
        this->ptr = pcVar9 + 1;
        *pcVar9 = ']';
      }
      else {
        do {
          pcVar9 = this->ptr;
          this->ptr = pcVar9 + 1;
          *pcVar9 = cVar11;
          cVar11 = "(["[lVar12 + 1];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 2);
        IVar6.raw = (int)sVar7;
        if (uVar10 == 3) {
          IVar6.raw = iVar2;
        }
        operator<<(this,IVar6);
        pcVar9 = this->ptr;
        this->ptr = pcVar9 + 1;
        *pcVar9 = ',';
        SVar4 = this->style->syntax;
        if ((uVar14 & 1) == 0) {
          if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
            pcVar9 = this->ptr;
            this->ptr = pcVar9 + 1;
            *pcVar9 = ' ';
          }
          operator<<(this);
        }
        else {
          if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
            pcVar9 = this->ptr;
            this->ptr = pcVar9 + 1;
            *pcVar9 = ' ';
          }
          operator<<(this);
        }
        pcVar9 = this->ptr;
        this->ptr = pcVar9 + 1;
        *pcVar9 = ']';
        if ((uVar13 & 1) == 0) {
          pcVar9 = this->ptr;
          this->ptr = pcVar9 + 1;
          *pcVar9 = ',';
          SVar4 = this->style->syntax;
          if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
            pcVar9 = this->ptr;
            this->ptr = pcVar9 + 1;
            *pcVar9 = ' ';
          }
          operator<<(this,rn);
          pcVar9 = "$%x.l";
          if ((uVar8 & 1) == 0) {
            pcVar9 = "$%x.w";
          }
          pcVar9 = pcVar9 + 3;
          cVar11 = *pcVar9;
          while (cVar11 != '\0') {
            pcVar9 = pcVar9 + 1;
            pcVar5 = this->ptr;
            this->ptr = pcVar5 + 1;
            *pcVar5 = cVar11;
            cVar11 = *pcVar9;
          }
          operator<<(this,s);
        }
      }
      pcVar9 = this->ptr;
      this->ptr = pcVar9 + 1;
      *pcVar9 = ',';
      SVar4 = this->style->syntax;
      if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
        pcVar9 = this->ptr;
        this->ptr = pcVar9 + 1;
        *pcVar9 = ' ';
      }
      operator<<(this,IVar3);
      goto LAB_00288674;
    }
    pcVar9 = this->ptr;
    this->ptr = pcVar9 + 1;
    *pcVar9 = '(';
    IVar3.raw = (int)sVar7;
    if (uVar10 == 3) {
      IVar3.raw = iVar2;
    }
    operator<<(this,IVar3);
    pcVar9 = this->ptr;
    this->ptr = pcVar9 + 1;
    *pcVar9 = ',';
    SVar4 = this->style->syntax;
    if ((uVar14 & 1) == 0) {
      if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
        pcVar9 = this->ptr;
        this->ptr = pcVar9 + 1;
        *pcVar9 = ' ';
      }
      operator<<(this);
    }
    else {
      if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
        pcVar9 = this->ptr;
        this->ptr = pcVar9 + 1;
        *pcVar9 = ' ';
      }
      operator<<(this);
    }
    if ((uVar13 & 1) != 0) goto LAB_00288674;
    pcVar9 = this->ptr;
    this->ptr = pcVar9 + 1;
    *pcVar9 = ',';
    SVar4 = this->style->syntax;
    if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
      pcVar9 = this->ptr;
      this->ptr = pcVar9 + 1;
      *pcVar9 = ' ';
    }
    operator<<(this,rn);
    pcVar9 = "$%x.l";
    if ((uVar8 & 1) == 0) {
      pcVar9 = "$%x.w";
    }
    pcVar9 = pcVar9 + 3;
    cVar11 = *pcVar9;
    while (cVar11 != '\0') {
      pcVar9 = pcVar9 + 1;
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = cVar11;
      cVar11 = *pcVar9;
    }
  }
  operator<<(this,s);
LAB_00288674:
  pcVar9 = this->ptr;
  this->ptr = pcVar9 + 1;
  *pcVar9 = ')';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMot<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        *this << "(" << Int{(i8)disp} << ",";
        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "," << Rn{reg} << (lw ? ".l" : ".w") << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        auto baseDisplacement = [&]() {
            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
        };
        auto baseRegister = [&]() {
            if constexpr (M == Mode(10)) {
                if (!bs) { *this << Sep{} << Pc{}; } else { *this << Sep{} << Zpc{}; }
            } else {
                if (!bs) { *this << Sep{} << An{ea.reg}; }
            }
        };
        auto indexRegister = [&]() {
            if (!is) *this << Sep{} << Rn{reg} << (lw ? ".l" : ".w") << Scale{scale};
        };
        auto outerDisplacement = [&]() {
            *this << Sep{} << Int(outer);
        };

        if (iis == 0) {

            // Memory Indirect Unindexed
            *this << "(";
            baseDisplacement(); baseRegister(); indexRegister();
            *this << ")";

        } else if (iis & 0b100) {

            // Memory Indirect Postindexed
            *this << "([";
            baseDisplacement(); baseRegister();
            *this << "]";
            indexRegister(); outerDisplacement();
            *this << ")";

        } else {

            // Memory Indirect Preindexed
            *this << "([";
            baseDisplacement(); baseRegister(); indexRegister();
            *this << "]";
            outerDisplacement();
            *this << ")";
        }
    }

    return *this;
}